

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode pausewrite(SessionHandle *data,int type,char *ptr,size_t len)

{
  char *__dest;
  char *dupl;
  SingleRequest *k;
  size_t len_local;
  char *ptr_local;
  int type_local;
  SessionHandle *data_local;
  
  __dest = (char *)(*Curl_cmalloc)(len);
  if (__dest == (char *)0x0) {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    memcpy(__dest,ptr,len);
    (data->state).tempwrite = __dest;
    (data->state).tempwritesize = len;
    (data->state).tempwritetype = type;
    (data->req).keepon = (data->req).keepon | 0x10;
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode pausewrite(struct SessionHandle *data,
                           int type, /* what type of data */
                           const char *ptr,
                           size_t len)
{
  /* signalled to pause sending on this connection, but since we have data
     we want to send we need to dup it to save a copy for when the sending
     is again enabled */
  struct SingleRequest *k = &data->req;
  char *dupl = malloc(len);
  if(!dupl)
    return CURLE_OUT_OF_MEMORY;

  memcpy(dupl, ptr, len);

  /* store this information in the state struct for later use */
  data->state.tempwrite = dupl;
  data->state.tempwritesize = len;
  data->state.tempwritetype = type;

  /* mark the connection as RECV paused */
  k->keepon |= KEEP_RECV_PAUSE;

  DEBUGF(infof(data, "Pausing with %zu bytes in buffer for type %02x\n",
               len, type));

  return CURLE_OK;
}